

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_endian.c
# Opt level: O2

void test_convert_htobe64(void)

{
  uint64_t check;
  uint64_t check_pattern;
  
  check_pattern = 0xf0debc9a78563412;
  check = cio_htobe64(0x123456789abcdef0);
  UnityAssertEqualMemory
            (&check_pattern,&check,8,1,"64 bit endian conversion incorrect!",0x6e,
             UNITY_ARRAY_TO_ARRAY);
  return;
}

Assistant:

static void test_convert_htobe64(void)
{
	uint8_t pattern_array[] = {0xf0, 0xde, 0xbc, 0x9a, 0x78, 0x56, 0x34, 0x12};
	uint64_t pattern;
	memcpy(&pattern, pattern_array, sizeof(pattern));
	uint64_t check_pattern = 0xf0debc9a78563412;

	uint64_t check = cio_htobe64(pattern);
	TEST_ASSERT_EQUAL_MEMORY_MESSAGE(&check_pattern, &check, sizeof(check), "64 bit endian conversion incorrect!");
}